

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  string_view str;
  EpsCopyInputStream *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  size_t size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_28 = size;
  size_local = (size_t)ptr;
  ptr_local = (char *)this;
  iVar2 = BytesAvailable(this,ptr);
  if ((ulong)(long)iVar2 < size) {
    this_local = (EpsCopyInputStream *)VerifyUTF8Fallback(this,(char *)size_local,local_28);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,(char *)size_local,local_28);
    str._M_str = extraout_RDX;
    str._M_len = (size_t)local_38._M_str;
    bVar1 = utf8_range::IsStructurallyValid((utf8_range *)local_38._M_len,str);
    if (bVar1) {
      local_50 = (EpsCopyInputStream *)(size_local + local_28);
    }
    else {
      local_50 = (EpsCopyInputStream *)0x0;
    }
    this_local = local_50;
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8(const char* ptr, size_t size) {
  if (size <= static_cast<size_t>(BytesAvailable(ptr))) {
    return utf8_range::IsStructurallyValid({ptr, size}) ? ptr + size : nullptr;
  }
  return VerifyUTF8Fallback(ptr, size);
}